

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

void pfx_table_swap(pfx_table *a,pfx_table *b)

{
  long lVar1;
  trie_node *ptVar2;
  trie_node *ptVar3;
  long in_FS_OFFSET;
  trie_node *ipv6_tmp;
  trie_node *ipv4_tmp;
  pfx_table *b_local;
  pfx_table *a_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&a->lock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&b->lock);
  ptVar2 = a->ipv4;
  ptVar3 = a->ipv6;
  a->ipv4 = b->ipv4;
  a->ipv6 = b->ipv6;
  b->ipv4 = ptVar2;
  b->ipv6 = ptVar3;
  pthread_rwlock_unlock((pthread_rwlock_t *)&b->lock);
  pthread_rwlock_unlock((pthread_rwlock_t *)&a->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pfx_table_swap(struct pfx_table *a, struct pfx_table *b)
{
	struct trie_node *ipv4_tmp;
	struct trie_node *ipv6_tmp;

	pthread_rwlock_wrlock(&(a->lock));
	pthread_rwlock_wrlock(&(b->lock));

	ipv4_tmp = a->ipv4;
	ipv6_tmp = a->ipv6;

	a->ipv4 = b->ipv4;
	a->ipv6 = b->ipv6;

	b->ipv4 = ipv4_tmp;
	b->ipv6 = ipv6_tmp;

	pthread_rwlock_unlock(&(b->lock));
	pthread_rwlock_unlock(&(a->lock));
}